

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

uint64_t GD::set_learn<true,true,true,true,0ul,0ul,0ul,1ul>(vw *all,gd *g)

{
  gd *g_local;
  vw *all_local;
  
  all->normalized_idx = 0;
  if ((g->adax & 1U) == 0) {
    g->learn = learn<true,true,true,true,false,0ul,0ul,0ul>;
    g->update = update<true,true,true,true,false,0ul,0ul,0ul>;
    g->sensitivity = sensitivity<true,true,false,0ul,0ul,0ul>;
  }
  else {
    g->learn = learn<true,true,true,true,true,0ul,0ul,0ul>;
    g->update = update<true,true,true,true,true,0ul,0ul,0ul>;
    g->sensitivity = sensitivity<true,true,true,0ul,0ul,0ul>;
  }
  return 1;
}

Assistant:

uint64_t set_learn(vw& all, gd& g)
{
  all.normalized_idx = normalized;
  if (g.adax)
  {
    g.learn = learn<sparse_l2, invariant, sqrt_rate, feature_mask_off, true, adaptive, normalized, spare>;
    g.update = update<sparse_l2, invariant, sqrt_rate, feature_mask_off, true, adaptive, normalized, spare>;
    g.sensitivity = sensitivity<sqrt_rate, feature_mask_off, true, adaptive, normalized, spare>;
    return next;
  }
  else
  {
    g.learn = learn<sparse_l2, invariant, sqrt_rate, feature_mask_off, false, adaptive, normalized, spare>;
    g.update = update<sparse_l2, invariant, sqrt_rate, feature_mask_off, false, adaptive, normalized, spare>;
    g.sensitivity = sensitivity<sqrt_rate, feature_mask_off, false, adaptive, normalized, spare>;
    return next;
  }
}